

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall S2Builder::CollectSiteEdges(S2Builder *this,S2PointIndex<int> *site_index)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  ostream *poVar6;
  compact_array_base<int,_std::allocator<int>_> *this_00;
  reference this_01;
  int *v;
  BasicVector<Vector3,_double,_3UL> *pBVar7;
  S2Point *x;
  S1ChordAngle x_00;
  Result *result;
  iterator __end2;
  iterator __begin2;
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  *__range2;
  value_type *sites;
  S2ClosestPointQueryEdgeTarget target;
  s2textformat local_430 [32];
  reference local_410;
  S2Point *v1;
  S2Point *v0;
  InputEdge *edge;
  InputEdgeId e;
  undefined1 local_3e8 [8];
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  results;
  S2ClosestPointQuery<int> site_query;
  undefined1 local_38 [8];
  S2ClosestPointQueryOptions options;
  S2PointIndex<int> *site_index_local;
  S2Builder *this_local;
  
  options.super_S2ClosestPointQueryBaseOptions<S2MinDistance>._24_8_ = site_index;
  S2ClosestPointQueryOptions::S2ClosestPointQueryOptions((S2ClosestPointQueryOptions *)local_38);
  S2ClosestPointQueryOptions::set_conservative_max_distance
            ((S2ClosestPointQueryOptions *)local_38,
             (S1ChordAngle)(this->edge_site_query_radius_ca_).length2_);
  S2ClosestPointQuery<int>::S2ClosestPointQuery
            ((S2ClosestPointQuery<int> *)
             &results.
              super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Index *)options.super_S2ClosestPointQueryBaseOptions<S2MinDistance>._24_8_,
             (S2ClosestPointQueryOptions *)local_38);
  std::
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ::vector((vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
            *)local_3e8);
  sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    (&this->input_edges_);
  std::
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ::resize(&this->edge_sites_,sVar4);
  for (edge._0_4_ = 0; uVar5 = (ulong)(int)edge,
      sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        (&this->input_edges_), uVar5 < sVar4; edge._0_4_ = (int)edge + 1) {
    v0 = (S2Point *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                   (&this->input_edges_,(long)(int)edge);
    v1 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                   (&this->input_vertices_,(long)((reference)v0)->first);
    local_410 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                          (&this->input_vertices_,(long)*(int *)((long)v0->c_ + 4));
    if ((s2builder_verbose & 1U) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"S2Polyline: ");
      s2textformat::ToString_abi_cxx11_(local_430,v1);
      poVar6 = std::operator<<(poVar6,(string *)local_430);
      poVar6 = std::operator<<(poVar6,", ");
      s2textformat::ToString_abi_cxx11_
                ((s2textformat *)(target.super_S2MinDistanceEdgeTarget.b_.c_ + 2),local_410);
      poVar6 = std::operator<<(poVar6,(string *)(target.super_S2MinDistanceEdgeTarget.b_.c_ + 2));
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)(target.super_S2MinDistanceEdgeTarget.b_.c_ + 2));
      std::__cxx11::string::~string((string *)local_430);
    }
    S2ClosestPointQueryEdgeTarget::S2ClosestPointQueryEdgeTarget
              ((S2ClosestPointQueryEdgeTarget *)&sites,v1,local_410);
    S2ClosestPointQuery<int>::FindClosestPoints
              ((S2ClosestPointQuery<int> *)
               &results.
                super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(Target *)&sites,
               (vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                *)local_3e8);
    this_00 = &std::
               vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
               ::operator[](&this->edge_sites_,(long)(int)edge)->
               super_compact_array_base<int,_std::allocator<int>_>;
    sVar4 = std::
            vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
            ::size((vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                    *)local_3e8);
    gtl::compact_array_base<int,_std::allocator<int>_>::reserve(this_00,(int)sVar4);
    __end2 = std::
             vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
             ::begin((vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                      *)local_3e8);
    result = (Result *)
             std::
             vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
             ::end((vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                    *)local_3e8);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result_*,_std::vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>_>
                                       *)&result), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result_*,_std::vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>_>
                ::operator*(&__end2);
      v = S2ClosestPointQueryBase<S2MinDistance,_int>::Result::data(this_01);
      gtl::compact_array_base<int,_std::allocator<int>_>::push_back(this_00,v);
      bVar1 = false;
      if ((this->snapping_needed_ & 1U) == 0) {
        x_00.length2_ =
             (double)S2ClosestPointQueryBase<S2MinDistance,_int>::Result::distance(this_01);
        bVar2 = ::operator<(x_00,(S1ChordAngle)(this->min_edge_site_separation_ca_limit_).length2_);
        bVar1 = false;
        if (bVar2) {
          pBVar7 = (BasicVector<Vector3,_double,_3UL> *)
                   S2ClosestPointQueryBase<S2MinDistance,_int>::Result::point(this_01);
          bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                            (pBVar7,v1);
          bVar1 = false;
          if (bVar2) {
            pBVar7 = (BasicVector<Vector3,_double,_3UL> *)
                     S2ClosestPointQueryBase<S2MinDistance,_int>::Result::point(this_01);
            bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                              (pBVar7,local_410);
            bVar1 = false;
            if (bVar2) {
              x = S2ClosestPointQueryBase<S2MinDistance,_int>::Result::point(this_01);
              iVar3 = s2pred::CompareEdgeDistance
                                (x,v1,local_410,
                                 (S1ChordAngle)(this->min_edge_site_separation_ca_).length2_);
              bVar1 = iVar3 < 0;
            }
          }
        }
      }
      if (bVar1) {
        this->snapping_needed_ = true;
      }
      __gnu_cxx::
      __normal_iterator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result_*,_std::vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>_>
      ::operator++(&__end2);
    }
    SortSitesByDistance(this,v1,(compact_array<int,_std::allocator<int>_> *)this_00);
    S2ClosestPointQueryEdgeTarget::~S2ClosestPointQueryEdgeTarget
              ((S2ClosestPointQueryEdgeTarget *)&sites);
  }
  std::
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ::~vector((vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
             *)local_3e8);
  S2ClosestPointQuery<int>::~S2ClosestPointQuery
            ((S2ClosestPointQuery<int> *)
             &results.
              super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void S2Builder::CollectSiteEdges(const S2PointIndex<SiteId>& site_index) {
  // Find all points whose distance is <= edge_site_query_radius_ca_.
  S2ClosestPointQueryOptions options;
  options.set_conservative_max_distance(edge_site_query_radius_ca_);
  S2ClosestPointQuery<SiteId> site_query(&site_index, options);
  vector<S2ClosestPointQuery<SiteId>::Result> results;
  edge_sites_.resize(input_edges_.size());
  for (InputEdgeId e = 0; e < input_edges_.size(); ++e) {
    const InputEdge& edge = input_edges_[e];
    const S2Point& v0 = input_vertices_[edge.first];
    const S2Point& v1 = input_vertices_[edge.second];
    if (s2builder_verbose) {
      std::cout << "S2Polyline: " << s2textformat::ToString(v0)
                << ", " << s2textformat::ToString(v1) << "\n";
    }
    S2ClosestPointQueryEdgeTarget target(v0, v1);
    site_query.FindClosestPoints(&target, &results);
    auto* sites = &edge_sites_[e];
    sites->reserve(results.size());
    for (const auto& result : results) {
      sites->push_back(result.data());
      if (!snapping_needed_ &&
          result.distance() < min_edge_site_separation_ca_limit_ &&
          result.point() != v0 && result.point() != v1 &&
          s2pred::CompareEdgeDistance(result.point(), v0, v1,
                                      min_edge_site_separation_ca_) < 0) {
        snapping_needed_ = true;
      }
    }
    SortSitesByDistance(v0, sites);
  }
}